

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  l_uint32 *plVar1;
  bool bVar2;
  int iVar3;
  BinOpr BVar4;
  anon_union_8_6_45a55102_for_u aVar5;
  UnOpr opr;
  BinOpr op;
  expdesc v2;
  expdesc local_48;
  
  luaE_incCstack(ls->L);
  iVar3 = (ls->t).token;
  if (iVar3 < 0x7e) {
    if (iVar3 == 0x23) {
      opr = OPR_LEN;
      goto LAB_00149b93;
    }
    if (iVar3 == 0x2d) {
      bVar2 = false;
      opr = OPR_MINUS;
    }
    else {
LAB_00149b7b:
      opr = OPR_NOUNOPR;
      bVar2 = true;
    }
  }
  else {
    if (iVar3 == 0x7e) {
      opr = OPR_BNOT;
    }
    else {
      if (iVar3 != 0x10e) goto LAB_00149b7b;
      opr = OPR_NOT;
    }
LAB_00149b93:
    bVar2 = false;
  }
  if (!bVar2) {
    iVar3 = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,0xc);
    luaK_prefix(ls->fs,opr,v,iVar3);
    goto LAB_00149d75;
  }
  if (iVar3 < 0x113) {
    if (iVar3 < 0x108) {
      if (iVar3 == 0x7b) {
        constructor(ls,v);
      }
      else {
        if (iVar3 == 0x106) {
          v->t = -1;
          v->f = -1;
          v->k = VFALSE;
LAB_00149d42:
          (v->u).info = 0;
          goto LAB_00149d6d;
        }
LAB_00149e51:
        suffixedexp(ls,v);
      }
    }
    else {
      if (iVar3 != 0x108) {
        if (iVar3 == 0x10d) {
          v->t = -1;
          v->f = -1;
          v->k = VNIL;
          goto LAB_00149d42;
        }
        goto LAB_00149e51;
      }
      luaX_next(ls);
      body(ls,v,0,ls->linenumber);
    }
  }
  else {
    if (iVar3 < 0x121) {
      if (iVar3 == 0x113) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_00149d42;
      }
      if (iVar3 != 0x118) goto LAB_00149e51;
      if (ls->fs->f->is_vararg == '\0') {
        luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
      }
      iVar3 = luaK_codeABCk(ls->fs,OP_VARARG,0,0,1,0);
      v->t = -1;
      v->f = -1;
      v->k = VVARARG;
      (v->u).info = iVar3;
    }
    else {
      if (iVar3 == 0x124) {
        aVar5 = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
        v->t = -1;
        v->f = -1;
        v->k = VKSTR;
      }
      else {
        if (iVar3 != 0x122) {
          if (iVar3 != 0x121) goto LAB_00149e51;
          v->t = -1;
          v->f = -1;
          v->k = VKFLT;
          (v->u).info = 0;
          v->u = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
          goto LAB_00149d6d;
        }
        v->t = -1;
        v->f = -1;
        v->k = VKINT;
        (v->u).info = 0;
        aVar5 = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
      }
      v->u = aVar5;
    }
LAB_00149d6d:
    luaX_next(ls);
  }
LAB_00149d75:
  iVar3 = (ls->t).token;
  if (iVar3 < 0x7e) {
    if (iVar3 < 0x3c) {
      switch(iVar3) {
      case 0x25:
        op = OPR_MOD;
        break;
      case 0x26:
        op = OPR_BAND;
        break;
      default:
        goto switchD_00149d9c_caseD_27;
      case 0x2a:
        op = OPR_MUL;
        break;
      case 0x2b:
        bVar2 = false;
        op = OPR_ADD;
        goto LAB_00149ec5;
      case 0x2d:
        op = OPR_SUB;
        break;
      case 0x2f:
        op = OPR_DIV;
      }
    }
    else if (iVar3 < 0x5e) {
      if (iVar3 == 0x3c) {
        op = OPR_LT;
      }
      else {
        if (iVar3 != 0x3e) goto switchD_00149d9c_caseD_27;
        op = OPR_GT;
      }
    }
    else if (iVar3 == 0x5e) {
      op = OPR_POW;
    }
    else {
      if (iVar3 != 0x7c) goto switchD_00149d9c_caseD_27;
      op = OPR_BOR;
    }
  }
  else {
    switch(iVar3) {
    case 0x10f:
      op = OPR_OR;
      break;
    case 0x110:
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x118:
switchD_00149d9c_caseD_27:
      op = OPR_NOBINOPR;
      bVar2 = true;
      goto LAB_00149ec5;
    case 0x116:
      op = OPR_IDIV;
      break;
    case 0x117:
      op = OPR_CONCAT;
      break;
    case 0x119:
      op = OPR_EQ;
      break;
    case 0x11a:
      op = OPR_GE;
      break;
    case 0x11b:
      op = OPR_LE;
      break;
    case 0x11c:
      op = OPR_NE;
      break;
    case 0x11d:
      op = OPR_SHL;
      break;
    case 0x11e:
      op = OPR_SHR;
      break;
    default:
      if (iVar3 == 0x7e) {
        op = OPR_BXOR;
      }
      else {
        if (iVar3 != 0x100) goto switchD_00149d9c_caseD_27;
        op = OPR_AND;
      }
    }
  }
  bVar2 = false;
LAB_00149ec5:
  if (!bVar2) {
    do {
      if ((int)(uint)priority[op].left <= limit) break;
      iVar3 = ls->linenumber;
      luaX_next(ls);
      luaK_infix(ls->fs,op,v);
      BVar4 = subexpr(ls,&local_48,(uint)priority[op].right);
      luaK_posfix(ls->fs,op,v,&local_48,iVar3);
      op = BVar4;
    } while (BVar4 != OPR_NOBINOPR);
  }
  plVar1 = &ls->L->nCcalls;
  *plVar1 = *plVar1 - 1;
  return op;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {  /* prefix (unary) operator? */
    int line = ls->linenumber;
    luaX_next(ls);  /* skip operator */
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v, line);
  }
  else simpleexp(ls, v);
  /* expand while operators have priorities higher than 'limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2;
    BinOpr nextop;
    int line = ls->linenumber;
    luaX_next(ls);  /* skip operator */
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    luaK_posfix(ls->fs, op, v, &v2, line);
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}